

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<const_kj::ReadableDirectory_*>::setCapacity
          (Vector<const_kj::ReadableDirectory_*> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<const_kj::ReadableDirectory_*> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<const_kj::ReadableDirectory_*> newBuilder;
  size_t newSize_local;
  Vector<const_kj::ReadableDirectory_*> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<const_kj::ReadableDirectory_*>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<const_kj::ReadableDirectory_*>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::ReadableDirectory_const*>
            ((ArrayBuilder<const_kj::ReadableDirectory_*> *)local_38,(kj *)newBuilder.disposer,size)
  ;
  pAVar2 = mv<kj::ArrayBuilder<kj::ReadableDirectory_const*>>(&this->builder);
  ArrayBuilder<kj::ReadableDirectory_const*>::addAll<kj::ArrayBuilder<kj::ReadableDirectory_const*>>
            ((ArrayBuilder<kj::ReadableDirectory_const*> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::ReadableDirectory_const*>>
                     ((ArrayBuilder<const_kj::ReadableDirectory_*> *)local_38);
  ArrayBuilder<const_kj::ReadableDirectory_*>::operator=(&this->builder,pAVar2);
  ArrayBuilder<const_kj::ReadableDirectory_*>::~ArrayBuilder
            ((ArrayBuilder<const_kj::ReadableDirectory_*> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }